

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shortest-paths.hxx
# Opt level: O1

bool andres::graph::
     spsp<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *g,
               SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *mask,size_t vs,size_t vt,deque<unsigned_long,_std::allocator<unsigned_long>_> *path,
               vector<long,_std::allocator<long>_> *parents)

{
  pointer pNVar1;
  size_t *psVar2;
  pointer plVar3;
  pointer plVar4;
  pointer pRVar5;
  pointer pAVar6;
  Value *pVVar7;
  _Elt_pointer puVar8;
  ulong uVar9;
  vector<long,_std::allocator<long>_> *pvVar10;
  byte bVar11;
  bool bVar12;
  ulong *extraout_RAX;
  ulong *puVar13;
  long lVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  Value VVar19;
  long lVar20;
  pointer pAVar21;
  bool bVar22;
  bool bVar23;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queues [2];
  Value local_138;
  undefined4 local_12c;
  size_t local_128;
  long local_120;
  size_t local_118;
  ulong local_110;
  vector<long,_std::allocator<long>_> *local_108;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *local_100;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *local_f8;
  SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_f0;
  ulong local_e8;
  ulong local_e0;
  undefined1 local_d8 [16];
  size_t *local_c8;
  deque<unsigned_long,std::allocator<unsigned_long>> adStack_c0 [8];
  deque<unsigned_long,std::allocator<unsigned_long>> local_b8 [8];
  deque<unsigned_long,std::allocator<unsigned_long>> adStack_b0 [8];
  size_t *local_a8;
  deque<unsigned_long,std::allocator<unsigned_long>> adStack_a0 [8];
  long local_98;
  deque<unsigned_long,std::allocator<unsigned_long>> adStack_90 [8];
  deque<unsigned_long,std::allocator<unsigned_long>> local_88 [16];
  ulong *local_78;
  ulong *local_58;
  long local_48;
  
  local_128 = vs;
  local_118 = vt;
  local_100 = g;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(path);
  sVar15 = mask->firstFrame_;
  pNVar1 = (mask->problem_->nodes).super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar16 = (size_t)pNVar1[local_128].t;
  if ((sVar15 == sVar16 || sVar15 + 1 == sVar16) &&
     (sVar16 = (size_t)pNVar1[local_118].t, sVar15 == sVar16 || sVar15 + 1 == sVar16)) {
    local_f0 = mask;
    if (local_128 == local_118) {
      psVar2 = (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (psVar2 == (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                    .super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<unsigned_long,std::allocator<unsigned_long>>::
        _M_push_back_aux<unsigned_long_const&>
                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)path,&local_128);
      }
      else {
        *psVar2 = local_128;
        (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_cur = psVar2 + 1;
      }
      bVar11 = 1;
    }
    else {
      std::vector<long,_std::allocator<long>_>::resize
                (parents,(long)(local_100->vertices_).
                               super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_100->vertices_).
                               super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
      plVar3 = (parents->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      plVar4 = (parents->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (plVar3 != plVar4) {
        memset(plVar3,0,((long)plVar4 + (-8 - (long)plVar3) & 0xfffffffffffffff8U) + 8);
      }
      plVar3[local_128] = local_128 + 1;
      plVar3[local_118] = ~local_118;
      lVar20 = 0;
      do {
        *(undefined8 *)(local_88 + lVar20 + -0x10) = 0;
        *(undefined8 *)(local_88 + lVar20 + -8) = 0;
        *(undefined8 *)(local_88 + lVar20 + -0x20) = 0;
        *(undefined8 *)(local_88 + lVar20 + -0x18) = 0;
        *(undefined8 *)(local_88 + lVar20 + -0x30) = 0;
        *(undefined8 *)(local_88 + lVar20 + -0x28) = 0;
        *(undefined8 *)(local_88 + lVar20 + -0x40) = 0;
        *(undefined8 *)(local_88 + lVar20 + -0x38) = 0;
        (((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_d8 + lVar20))->
        _M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        *(undefined8 *)(local_88 + lVar20 + -0x48) = 0;
        std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                  ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_d8 + lVar20)
                   ,0);
        lVar20 = lVar20 + 0x50;
      } while (lVar20 != 0xa0);
      if (local_a8 == (size_t *)(local_98 + -8)) {
        std::deque<unsigned_long,std::allocator<unsigned_long>>::
        _M_push_back_aux<unsigned_long_const&>
                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)local_d8,&local_128);
      }
      else {
        *local_a8 = local_128;
        local_a8 = local_a8 + 1;
      }
      if (local_58 == (ulong *)(local_48 + -8)) {
        std::deque<unsigned_long,std::allocator<unsigned_long>>::
        _M_push_back_aux<unsigned_long_const&>(local_88,&local_118);
        puVar13 = extraout_RAX;
      }
      else {
        *local_58 = local_118;
        puVar13 = local_58 + 1;
        local_58 = puVar13;
      }
      lVar20 = 0;
      local_12c = SUB84(puVar13,0);
      local_108 = parents;
      do {
        lVar14 = lVar20 * 0x50;
        local_e8 = (*(long *)(local_88 + lVar14 + -0x30) - *(long *)(local_88 + lVar14 + -0x40) >> 3
                   ) + (*(long *)(local_88 + lVar14 + -0x20) - *(long *)(local_88 + lVar14 + -0x18)
                       >> 3) + ((((ulong)(*(long *)(local_88 + lVar14 + -8) -
                                         *(long *)(local_88 + lVar14 + -0x28)) >> 3) - 1) +
                               (ulong)(*(long *)(local_88 + lVar14 + -8) == 0)) * 0x40;
        bVar22 = local_e8 != 0;
        local_120 = lVar20;
        if (bVar22) {
          local_f8 = (deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (local_d8 + lVar20 * 0x50);
          uVar18 = 0;
          do {
            uVar17 = *(local_f8->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_cur;
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(local_f8);
            pRVar5 = (local_100->vertices_).
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pAVar21 = *(pointer *)
                       &pRVar5[uVar17].vector_.
                        super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
            ;
            pAVar6 = *(pointer *)
                      ((long)&pRVar5[uVar17].vector_.
                              super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                      + 8);
            bVar23 = pAVar21 == pAVar6;
            if (!bVar23) {
              local_110 = uVar18;
              local_e0 = ~uVar17;
              if (local_120 == 0) {
                local_e0 = uVar17 + 1;
              }
LAB_0011d9cc:
              bVar12 = lineage::ProblemGraph::
                       SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::edge(local_f0,pAVar21->edge_);
              pvVar10 = local_108;
              if ((!bVar12) ||
                 (VVar19 = pAVar21->vertex_,
                 sVar15 = (size_t)(local_f0->problem_->nodes).
                                  super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                                  _M_impl.super__Vector_impl_data._M_start[VVar19].t,
                 local_f0->firstFrame_ + 1 != sVar15 && local_f0->firstFrame_ != sVar15))
              goto LAB_0011da65;
              plVar3 = (local_108->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              lVar20 = plVar3[VVar19];
              if ((local_120 == 0) && (lVar20 < 0)) {
                do {
                  puVar8 = (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_cur;
                  local_138 = uVar17;
                  if (puVar8 == (path->
                                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Deque_impl_data._M_start._M_first) {
                    std::deque<unsigned_long,std::allocator<unsigned_long>>::
                    _M_push_front_aux<unsigned_long_const&>
                              ((deque<unsigned_long,std::allocator<unsigned_long>> *)path,&local_138
                              );
                  }
                  else {
                    puVar8[-1] = uVar17;
                    (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                    .super__Deque_impl_data._M_start._M_cur = puVar8 + -1;
                  }
                  uVar17 = (pvVar10->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                           super__Vector_impl_data._M_start[local_138] - 1;
                } while (uVar17 != local_138);
                do {
                  pVVar7 = (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Deque_impl_data._M_finish._M_cur;
                  local_138 = VVar19;
                  if (pVVar7 == (path->
                                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    std::deque<unsigned_long,std::allocator<unsigned_long>>::
                    _M_push_back_aux<unsigned_long_const&>
                              ((deque<unsigned_long,std::allocator<unsigned_long>> *)path,&local_138
                              );
                  }
                  else {
                    *pVVar7 = VVar19;
                    (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                    .super__Deque_impl_data._M_finish._M_cur = pVVar7 + 1;
                  }
                  uVar18 = (pvVar10->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                           super__Vector_impl_data._M_start[local_138];
                  VVar19 = ~uVar18;
                } while ((local_138 ^ uVar18) != 0xffffffffffffffff);
                local_12c = 0xffffff01;
                uVar18 = local_110;
              }
              else {
                if ((local_120 != 1) || (lVar20 < 1)) {
                  if (lVar20 == 0) {
                    plVar3[VVar19] = local_e0;
                    local_138 = pAVar21->vertex_;
                    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                    emplace_back<unsigned_long>(local_f8,&local_138);
                  }
                  goto LAB_0011da65;
                }
                do {
                  puVar8 = (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_cur;
                  local_138 = VVar19;
                  if (puVar8 == (path->
                                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Deque_impl_data._M_start._M_first) {
                    std::deque<unsigned_long,std::allocator<unsigned_long>>::
                    _M_push_front_aux<unsigned_long_const&>
                              ((deque<unsigned_long,std::allocator<unsigned_long>> *)path,&local_138
                              );
                  }
                  else {
                    puVar8[-1] = VVar19;
                    (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                    .super__Deque_impl_data._M_start._M_cur = puVar8 + -1;
                  }
                  uVar18 = local_110;
                  VVar19 = (pvVar10->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                           super__Vector_impl_data._M_start[local_138] - 1;
                } while (VVar19 != local_138);
                do {
                  puVar13 = (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  local_138 = uVar17;
                  if (puVar13 ==
                      (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    std::deque<unsigned_long,std::allocator<unsigned_long>>::
                    _M_push_back_aux<unsigned_long_const&>
                              ((deque<unsigned_long,std::allocator<unsigned_long>> *)path,&local_138
                              );
                  }
                  else {
                    *puVar13 = uVar17;
                    (path->super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                    .super__Deque_impl_data._M_finish._M_cur = puVar13 + 1;
                  }
                  uVar9 = (pvVar10->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                          super__Vector_impl_data._M_start[local_138];
                  uVar17 = ~uVar9;
                } while ((local_138 ^ uVar9) != 0xffffffffffffffff);
                local_12c = 0xffffff01;
              }
            }
LAB_0011db12:
            if (!bVar23) break;
            uVar18 = uVar18 + 1;
            bVar22 = uVar18 < local_e8;
          } while (uVar18 != local_e8);
        }
        if (bVar22) {
          bVar22 = false;
        }
        else if ((local_a8 == local_c8) && (local_58 == local_78)) {
          bVar22 = false;
          local_12c = 0;
        }
        else {
          bVar22 = true;
        }
        lVar20 = 1 - local_120;
      } while (bVar22);
      lVar20 = 0x50;
      do {
        std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                  ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_d8 + lVar20)
                  );
        lVar20 = lVar20 + -0x50;
      } while (lVar20 != -0x50);
      bVar11 = (byte)local_12c;
    }
  }
  else {
    bVar11 = 0;
  }
  return (bool)(bVar11 & 1);
LAB_0011da65:
  pAVar21 = pAVar21 + 1;
  bVar23 = pAVar21 == pAVar6;
  uVar18 = local_110;
  if (bVar23) goto LAB_0011db12;
  goto LAB_0011d9cc;
}

Assistant:

bool 
spsp(
    const GRAPH& g, 
    const SUBGRAPH_MASK& mask,
    const std::size_t vs,
    const std::size_t vt,
    std::deque<std::size_t>& path,
    std::vector<std::ptrdiff_t>& parents// = std::vector<std::ptrdiff_t>()
) {
    path.clear();
    if(!mask.vertex(vs) || !mask.vertex(vt)) {
        return false;
    }
    if(vs == vt) {
        path.push_back(vs);
        return true;
    }
    parents.resize(g.numberOfVertices());
    std::fill(parents.begin(), parents.end(), 0);
    parents[vs] = vs + 1;
    parents[vt] = -static_cast<std::ptrdiff_t>(vt) - 1;
    std::queue<std::size_t> queues[2];
    queues[0].push(vs);
    queues[1].push(vt);
    for(std::size_t q = 0; true; q = 1 - q) { // infinite loop, alternating queues
        const std::size_t numberOfNodesAtFront = queues[q].size();
        for(std::size_t n = 0; n < numberOfNodesAtFront; ++n) {
            const std::size_t v = queues[q].front();
            queues[q].pop();
            typename GRAPH::AdjacencyIterator it;
            typename GRAPH::AdjacencyIterator end;
            if(q == 0) {
                it = g.adjacenciesFromVertexBegin(v);
                end = g.adjacenciesFromVertexEnd(v);
            }
            else {
                it = g.adjacenciesToVertexBegin(v);
                end = g.adjacenciesToVertexEnd(v);
            }
            for(; it != end; ++it) {
                if(!mask.edge(it->edge()) || !mask.vertex(it->vertex())) {
                    continue;
                }
                if(parents[it->vertex()] < 0 && q == 0) {
                    graph_detail::spspHelper(parents, v, it->vertex(), path);
                    assert(path[0] == vs);
                    assert(path.back() == vt);
                    return true;
                }
                else if(parents[it->vertex()] > 0 && q == 1) {
                    graph_detail::spspHelper(parents, it->vertex(), v, path);
                    assert(path[0] == vs);
                    assert(path.back() == vt);
                    return true;
                }
                else if(parents[it->vertex()] == 0) {
                    if(q == 0) {
                        parents[it->vertex()] = v + 1;
                    }
                    else {
                        parents[it->vertex()] = -static_cast<std::ptrdiff_t>(v) - 1;
                    }
                    queues[q].push(it->vertex());
                }
            }
        }
        if(queues[0].empty() && queues[1].empty()) {
            return false;
        }
    }
}